

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O1

string * ApprovalTests::FileNameSanitizerFactory::defaultSanitizer
                   (string *__return_storage_ptr__,string *fileName)

{
  char c;
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  bool bVar4;
  size_type sVar5;
  stringstream result;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  sVar1 = fileName->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (fileName->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      c = pcVar2[sVar5];
      bVar4 = isForbidden(c);
      if (bVar4) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_",1);
      }
      else {
        local_1c1 = c;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c1,1);
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  psVar3 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string FileNameSanitizerFactory::defaultSanitizer(std::string fileName)
    {
        std::stringstream result;
        for (auto ch : fileName)
        {
            if (!isForbidden(ch))
            {
                result << ch;
            }
            else
            {
                result << "_";
            }
        }
        return result.str();
    }